

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocs.c
# Opt level: O2

void write_relocs(void)

{
  reloc_t **pprVar1;
  reloc_entry_t reloc;
  block_header_t header;
  reloc_entry_t local_28;
  block_header_t local_10;
  
  if (relocs_count != 0) {
    local_10.type = relocations;
    local_10.num_entries = relocs_count;
    write_block_header(&local_10);
    pprVar1 = &root;
    while( true ) {
      cur = *pprVar1;
      if (cur == (reloc_s *)0x0) break;
      local_28.sym_id = cur->sym_id;
      local_28.section_id = cur->section_id;
      local_28.offset = cur->offset;
      local_28.flags = cur->flags;
      write_reloc_entry(&local_28);
      pprVar1 = &cur->next;
    }
    cur = (reloc_t *)0x0;
  }
  return;
}

Assistant:

void write_relocs()
{
    block_header_t header;
    reloc_entry_t reloc;
    if (relocs_count == 0)
        return;
    
    header.type = relocations;
    header.num_entries = relocs_count;
    write_block_header(&header);
    
    cur = root;
    while (cur)
    {
        reloc.sym_id = cur->sym_id;
        reloc.section_id = cur->section_id;
        reloc.offset = cur->offset;
        reloc.flags = cur->flags;
        write_reloc_entry(&reloc);
        cur = cur->next;
    }
}